

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySubImage3D::delete2DTexture(TextureCubeMapArraySubImage3D *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureCubeMapArraySubImage3D *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xb8))(0xde1,0);
  if (this->m_tex_2d_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_tex_2d_id);
    this->m_tex_2d_id = 0;
  }
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::delete2DTexture()
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES configuration */
	gl.bindTexture(GL_TEXTURE_2D, 0);

	/* Delete texture object */
	if (m_tex_2d_id != 0)
	{
		gl.deleteTextures(1, &m_tex_2d_id);
		m_tex_2d_id = 0;
	}
}